

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputComponentTest::getShaderInterface
          (XFBCaptureInactiveOutputComponentTest *this,GLuint test_case_index,STAGES stage,
          string *out_interface)

{
  char *pcVar1;
  TestError *this_00;
  char *__s;
  bool bVar2;
  
  switch(stage) {
  case VERTEX:
    bVar2 = test_case_index == 0;
    break;
  case TESS_CTRL:
    __s = glcts::fixed_sample_locations_values + 1;
    goto LAB_008ba1b3;
  case TESS_EVAL:
    bVar2 = test_case_index == 1;
    break;
  case GEOMETRY:
    bVar2 = test_case_index == 2;
    break;
  case FRAGMENT:
    __s = 
    "in vec4 vegeta;\nin vec4 trunks;\nin vec4 bra;\nin vec4 bulma;\nin vec4 goku;\nin vec4 gohan;\nin vec4 goten;\nin vec4 chichi;\n\nout vec4 fs_out;\n"
    ;
    goto LAB_008ba1b3;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x6719);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __s = glcts::fixed_sample_locations_values + 1;
  if (bVar2) {
    __s = 
    "const uint sizeof_type = 16;\n\nlayout (xfb_offset = 2 * sizeof_type) out vec4 goku;\nlayout (xfb_offset = 0 * sizeof_type) out vec4 gohan;\nlayout (xfb_offset = 1 * sizeof_type) out vec4 goten;\nlayout (xfb_offset = 3 * sizeof_type) out vec4 chichi;\nlayout (xfb_offset = 7 * sizeof_type) out vec4 vegeta;\nlayout (xfb_offset = 6 * sizeof_type) out vec4 trunks;\nlayout (xfb_offset = 5 * sizeof_type) out vec4 bra;\nlayout (xfb_offset = 4 * sizeof_type) out vec4 bulma;\n\nlayout(binding = 0) uniform block {\n    vec4 uni_goku;\n    vec4 uni_gohan;\n    vec4 uni_goten;\n    vec4 uni_chichi;\n    vec4 uni_vegeta;\n    vec4 uni_trunks;\n    vec4 uni_bra;\n    vec4 uni_bulma;\n};\n"
    ;
  }
LAB_008ba1b3:
  pcVar1 = (char *)out_interface->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)out_interface,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

void XFBCaptureInactiveOutputComponentTest::getShaderInterface(GLuint test_case_index, Utils::Shader::STAGES stage,
															   std::string& out_interface)
{
	static const GLchar* vs_tes_gs = "const uint sizeof_type = 16;\n"
									 "\n"
									 "layout (xfb_offset = 2 * sizeof_type) out vec4 goku;\n"
									 "layout (xfb_offset = 0 * sizeof_type) out vec4 gohan;\n"
									 "layout (xfb_offset = 1 * sizeof_type) out vec4 goten;\n"
									 "layout (xfb_offset = 3 * sizeof_type) out vec4 chichi;\n"
									 "layout (xfb_offset = 7 * sizeof_type) out vec4 vegeta;\n"
									 "layout (xfb_offset = 6 * sizeof_type) out vec4 trunks;\n"
									 "layout (xfb_offset = 5 * sizeof_type) out vec4 bra;\n"
									 "layout (xfb_offset = 4 * sizeof_type) out vec4 bulma;\n"
									 "\n"
									 "layout(binding = 0) uniform block {\n"
									 "    vec4 uni_goku;\n"
									 "    vec4 uni_gohan;\n"
									 "    vec4 uni_goten;\n"
									 "    vec4 uni_chichi;\n"
									 "    vec4 uni_vegeta;\n"
									 "    vec4 uni_trunks;\n"
									 "    vec4 uni_bra;\n"
									 "    vec4 uni_bulma;\n"
									 "};\n";
	static const GLchar* fs = "in vec4 vegeta;\n"
							  "in vec4 trunks;\n"
							  "in vec4 bra;\n"
							  "in vec4 bulma;\n"
							  "in vec4 goku;\n"
							  "in vec4 gohan;\n"
							  "in vec4 goten;\n"
							  "in vec4 chichi;\n"
							  "\n"
							  "out vec4 fs_out;\n";

	const GLchar* interface = "";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		interface = fs;
		break;

	case Utils::Shader::GEOMETRY:
		if (TEST_GS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::TESS_CTRL:
		break;

	case Utils::Shader::TESS_EVAL:
		if (TEST_TES == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::VERTEX:
		if (TEST_VS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	default:
		TCU_FAIL("Invalid enum");
	}

	out_interface = interface;
}